

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O1

void uv__fs_work(uv__work *w)

{
  uv_loop_s **buf;
  int iVar1;
  uv__work *ptr;
  iovec *__iovec;
  _func_void_uv__work_ptr_int *p_Var2;
  bool bVar3;
  __mode_t __mode;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uv_dirent_type_t uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint *puVar11;
  void *pvVar12;
  size_t sVar13;
  _func_void_uv__work_ptr *p_Var14;
  ssize_t sVar15;
  size_t sVar16;
  size_t sVar17;
  dirent *dent;
  char *pcVar18;
  DIR *pDVar19;
  ssize_t sVar20;
  _func_void_uv__work_ptr *p_Var21;
  long lVar22;
  _func_void_uv__work_ptr_int *p_Var23;
  code *pcVar24;
  _func_void_uv__work_ptr_int *p_Var25;
  int iVar26;
  _func_void_uv__work_ptr_int *p_Var27;
  ulong uVar28;
  size_t sVar29;
  uint minor;
  uint major;
  pollfd pfd;
  utsname u;
  int local_217c;
  int local_2178;
  int local_2174;
  uv__work *local_2170;
  long local_2168;
  undefined1 *local_2160;
  stat local_2158;
  stat local_20c8;
  undefined1 local_2038 [16];
  void *local_2028;
  void *local_2020;
  uint local_2018;
  int iStack_2014;
  uv_loop_s *local_2010;
  void *local_2008;
  __fsid_t local_2000;
  uv_fs_type local_1ff8;
  char acStack_1ff4 [4];
  uv_loop_t *local_1ff0;
  uv_fs_cb p_Stack_1fe8;
  _func_void_uv__work_ptr_int *local_1fe0;
  uv_loop_s *puStack_1fd8;
  _func_void_uv__work_ptr *local_1fd0;
  _func_void_uv__work_ptr_int *local_1fc8;
  undefined1 local_1fb6 [142];
  char *local_1f28;
  int local_1f20;
  int local_1f1c;
  uv_buf_t *local_1f10;
  _func_void_uv__work_ptr_int *local_1f08;
  uv__work local_1ee8;
  size_t local_1eb8;
  
  iVar1 = *(int *)&w[-7].done;
  puVar11 = (uint *)__errno_location();
  local_2170 = w + 1;
  buf = &w[-6].loop;
  do {
    *puVar11 = 0;
    switch(*(undefined4 *)&w[-7].done) {
    case 1:
      iVar4 = open((char *)w[-6].done,*(uint *)((long)w[-2].wq + 4) | 0x80000,
                   (ulong)*(uint *)(w[-2].wq + 1));
      break;
    case 2:
      iVar4 = uv__close_nocancel(*(int *)w[-2].wq);
      if (iVar4 == -1) {
        iVar4 = -(uint)(*puVar11 != 0x73 && *puVar11 != 4);
      }
      break;
    case 3:
      uVar8 = uv__getiovmax();
      if (uVar8 < *(uint *)((long)w[-2].wq + 0xc)) {
        *(uint *)((long)w[-2].wq + 0xc) = uVar8;
      }
      p_Var23 = w[-1].done;
      iVar4 = *(int *)((long)w[-2].wq + 0xc);
      if ((long)p_Var23 < 0) {
        if (iVar4 == 1) {
          p_Var23 = (_func_void_uv__work_ptr_int *)
                    read(*(int *)w[-2].wq,*(void **)w[-1].work,*(size_t *)(w[-1].work + 8));
        }
        else {
          p_Var23 = (_func_void_uv__work_ptr_int *)readv(*(int *)w[-2].wq,(iovec *)w[-1].work,iVar4)
          ;
        }
      }
      else if (iVar4 == 1) {
        p_Var23 = (_func_void_uv__work_ptr_int *)
                  pread(*(int *)w[-2].wq,*(void **)w[-1].work,*(size_t *)(w[-1].work + 8),
                        (__off_t)p_Var23);
      }
      else {
        if (uv__fs_read_no_preadv != '\x01') {
          p_Var23 = (_func_void_uv__work_ptr_int *)
                    uv__preadv(*(int *)w[-2].wq,(iovec *)w[-1].work,iVar4,(int64_t)p_Var23);
          if ((p_Var23 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) ||
             (p_Var23 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff, *puVar11 != 0x26))
          goto LAB_0022f684;
          uv__fs_read_no_preadv = '\x01';
        }
        uVar28 = (ulong)*(uint *)((long)w[-2].wq + 0xc);
        if (uVar28 == 0) {
          __assert_fail("nbufs > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/fs.c"
                        ,0x1af,"ssize_t uv__fs_preadv(uv_file, uv_buf_t *, unsigned int, off_t)");
        }
        iVar4 = *(int *)w[-2].wq;
        p_Var27 = w[-1].done;
        p_Var14 = w[-1].work;
        p_Var21 = p_Var14 + uVar28 * 0x10;
        p_Var23 = (_func_void_uv__work_ptr_int *)0x0;
        do {
          uVar28 = 0;
          do {
            do {
              sVar15 = pread(iVar4,(void *)(*(long *)p_Var14 + uVar28),
                             *(long *)(p_Var14 + 8) - uVar28,(__off_t)(p_Var27 + (long)p_Var23));
              if (sVar15 != -1) break;
            } while (*puVar11 == 4);
            if (sVar15 == 0) goto LAB_0022f684;
            if (sVar15 == -1 && p_Var23 == (_func_void_uv__work_ptr_int *)0x0) {
              p_Var23 = (_func_void_uv__work_ptr_int *)-(long)(int)*puVar11;
              goto LAB_0022f684;
            }
            if (sVar15 == -1) goto LAB_0022f684;
            uVar28 = uVar28 + sVar15;
            p_Var23 = p_Var23 + sVar15;
          } while (uVar28 < *(ulong *)(p_Var14 + 8));
          p_Var14 = p_Var14 + 0x10;
        } while (p_Var14 != p_Var21);
      }
LAB_0022f684:
      if ((uv__work *)w[-1].work != local_2170) {
        uv__free((uv__work *)w[-1].work);
      }
      w[-1].work = (_func_void_uv__work_ptr *)0x0;
      *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
      goto LAB_0022f90c;
    case 4:
      uVar5 = uv__getiovmax();
      uVar8 = *(uint *)((long)w[-2].wq + 0xc);
      ptr = (uv__work *)w[-1].work;
      if (uVar8 == 0) {
        p_Var23 = (_func_void_uv__work_ptr_int *)0x0;
      }
      else {
        p_Var23 = (_func_void_uv__work_ptr_int *)0x0;
        do {
          uVar6 = uVar5;
          if (uVar8 < uVar5) {
            uVar6 = uVar8;
          }
          *(uint *)((long)w[-2].wq + 0xc) = uVar6;
          do {
            p_Var27 = w[-1].done;
            iVar4 = *(int *)((long)w[-2].wq + 0xc);
            if ((long)p_Var27 < 0) {
              __iovec = (iovec *)w[-1].work;
              if (iVar4 == 1) {
                p_Var27 = (_func_void_uv__work_ptr_int *)
                          write(*(int *)w[-2].wq,__iovec->iov_base,__iovec->iov_len);
              }
              else {
                p_Var27 = (_func_void_uv__work_ptr_int *)writev(*(int *)w[-2].wq,__iovec,iVar4);
              }
            }
            else {
              if (iVar4 == 1) {
                iVar4 = *(int *)w[-2].wq;
                pvVar12 = *(void **)w[-1].work;
                sVar13 = *(size_t *)(w[-1].work + 8);
              }
              else {
                if (uv__fs_write_no_pwritev != '\x01') {
                  p_Var27 = (_func_void_uv__work_ptr_int *)
                            uv__pwritev(*(int *)w[-2].wq,(iovec *)w[-1].work,iVar4,(int64_t)p_Var27)
                  ;
                  if ((p_Var27 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) ||
                     (p_Var27 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff, *puVar11 != 0x26)
                     ) goto LAB_0022eb09;
                  uv__fs_write_no_pwritev = '\x01';
                }
                iVar4 = *(int *)w[-2].wq;
                pvVar12 = *(void **)w[-1].work;
                sVar13 = *(size_t *)(w[-1].work + 8);
                p_Var27 = w[-1].done;
              }
              p_Var27 = (_func_void_uv__work_ptr_int *)pwrite(iVar4,pvVar12,sVar13,(__off_t)p_Var27)
              ;
            }
LAB_0022eb09:
          } while (((long)p_Var27 < 0) && (*puVar11 == 4));
          if ((long)p_Var27 < 1) {
            if (p_Var23 == (_func_void_uv__work_ptr_int *)0x0) {
              p_Var23 = p_Var27;
            }
            break;
          }
          if (-1 < (long)w[-1].done) {
            w[-1].done = w[-1].done + (long)p_Var27;
          }
          p_Var14 = w[-1].work;
          pcVar24 = p_Var14 + 8;
          uVar6 = 0;
          p_Var25 = p_Var27;
          do {
            p_Var2 = *(_func_void_uv__work_ptr_int **)pcVar24;
            if (p_Var25 < p_Var2) {
              *(_func_void_uv__work_ptr_int **)(pcVar24 + -8) = p_Var25 + *(ulong *)(pcVar24 + -8);
              *(ulong *)pcVar24 = *(ulong *)pcVar24 - (long)p_Var25;
              break;
            }
            uVar6 = uVar6 + 1;
            pcVar24 = pcVar24 + 0x10;
            p_Var25 = p_Var25 + -(long)p_Var2;
          } while (p_Var25 != (_func_void_uv__work_ptr_int *)0x0);
          *(uint *)((long)w[-2].wq + 0xc) = uVar6;
          w[-1].work = p_Var14 + (ulong)uVar6 * 0x10;
          p_Var23 = p_Var23 + (long)p_Var27;
          uVar8 = uVar8 - uVar6;
        } while (uVar8 != 0);
      }
      if (ptr != local_2170) {
        uv__free(ptr);
      }
      w[-1].work = (_func_void_uv__work_ptr *)0x0;
      *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
      goto LAB_0022f90c;
    case 5:
      iVar4 = *(int *)w[-2].wq;
      iVar10 = *(int *)((long)w[-2].wq + 4);
      local_20c8.st_dev = (__dev_t)w[-1].done;
      p_Var23 = w[1].done;
      if (uv__fs_try_copy_file_range_no_copy_file_range_support == '\x01') goto LAB_0022e64e;
      sVar20 = uv__fs_copy_file_range
                         (iVar10,(off_t *)&local_20c8,iVar4,(off_t *)0x0,(size_t)p_Var23,0);
      if (sVar20 == -1) {
        uVar8 = *puVar11;
        if ((int)uVar8 < 0x12) {
          if (uVar8 == 1) {
            iVar9 = uv__is_cifs_or_smb(iVar4);
            if (iVar9 != 0) goto LAB_0022e64e;
          }
          else if (((uVar8 == 0xd) && (iVar9 = fstatfs(iVar10,(statfs *)&local_2158), iVar9 != -1))
                  && (CONCAT26(local_2158.st_dev._6_2_,
                               CONCAT24(local_2158.st_dev._4_2_,(int)local_2158.st_dev)) == 0xc36400
                     )) {
            uVar8 = uv__kernel_version_cached_version;
            if (uv__kernel_version_cached_version == 0) {
              iVar9 = uname((utsname *)local_2038);
              if (iVar9 == -1) {
                uVar8 = 0;
              }
              else {
                uVar8 = 0;
                iVar9 = __isoc99_sscanf(local_1fb6,"%u.%u.%u",&local_2174,&local_2178);
                if (iVar9 == 3) {
                  uVar8 = local_2178 * 0x100 + local_2174 * 0x10000 + local_217c;
                  uv__kernel_version_cached_version = uVar8;
                }
              }
            }
            if (uVar8 < 0x41400) goto LAB_0022e64e;
          }
        }
        else if (uVar8 == 0x12) {
LAB_0022e64e:
          *puVar11 = 0x26;
        }
        else if (uVar8 == 0x26) {
          uv__fs_try_copy_file_range_no_copy_file_range_support = '\x01';
        }
        else if (uVar8 == 0x5f) goto LAB_0022e64e;
        if (((*puVar11 != 0x26) ||
            (sVar15 = sendfile(iVar4,iVar10,(off_t *)&local_20c8,(size_t)p_Var23), sVar15 == -1)) &&
           (p_Var27 = w[-1].done, (long)local_20c8.st_dev <= (long)p_Var27)) {
          uVar8 = *puVar11;
          if (((uVar8 < 0x17) && ((0x440020U >> (uVar8 & 0x1f) & 1) != 0)) ||
             (p_Var23 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff, uVar8 == 0x58)) {
            *puVar11 = 0;
            p_Var25 = w[1].done;
            if (p_Var25 == (_func_void_uv__work_ptr_int *)0x0) {
              p_Var23 = (_func_void_uv__work_ptr_int *)0x0;
            }
            else {
              iVar4 = *(int *)w[-2].wq;
              iVar10 = *(int *)((long)w[-2].wq + 4);
              bVar3 = true;
              p_Var2 = (_func_void_uv__work_ptr_int *)0x0;
              do {
                while( true ) {
                  p_Var23 = p_Var2;
                  sVar13 = (long)p_Var25 - (long)p_Var23;
                  if (0x1fff < sVar13) {
                    sVar13 = 0x2000;
                  }
                  do {
                    if (bVar3) {
                      sVar16 = pread(iVar10,local_2038,sVar13,(__off_t)p_Var27);
                    }
                    else {
                      sVar16 = read(iVar10,local_2038,sVar13);
                    }
                  } while ((sVar16 == 0xffffffffffffffff) && (*puVar11 == 4));
                  if (sVar16 == 0) goto LAB_0022f841;
                  if (sVar16 == 0xffffffffffffffff) break;
                  if (0 < (long)sVar16) {
                    lVar22 = 0;
                    sVar13 = sVar16;
LAB_0022e7a4:
                    local_2160 = local_2038 + lVar22;
                    local_2168 = lVar22;
LAB_0022e7b7:
                    do {
                      sVar15 = write(iVar4,local_2160,sVar13);
                      if (sVar15 != -1) goto LAB_0022e82a;
                      if (*puVar11 != 4) {
                        if (*puVar11 == 0xb) {
                          local_2158.st_dev._4_2_ = 4;
                          local_2158.st_dev._6_2_ = 0;
                          local_2158.st_dev._0_4_ = iVar4;
                          while (iVar9 = poll((pollfd *)&local_2158,1,-1), iVar9 == -1) {
                            if (*puVar11 != 4) goto LAB_0022f824;
                          }
                          if ((local_2158.st_dev._6_2_ & 0xfffb) == 0) goto LAB_0022e7b7;
LAB_0022f824:
                          *puVar11 = 5;
                        }
                        p_Var23 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
                        goto LAB_0022f841;
                      }
                    } while( true );
                  }
LAB_0022e841:
                  p_Var27 = p_Var27 + sVar16;
                  p_Var23 = p_Var23 + sVar16;
                  p_Var2 = p_Var23;
                  if (p_Var25 <= p_Var23) goto LAB_0022f841;
                }
                if ((!bVar3) || (p_Var23 != (_func_void_uv__work_ptr_int *)0x0)) break;
                bVar3 = false;
                p_Var2 = (_func_void_uv__work_ptr_int *)0x0;
              } while ((*puVar11 == 5) ||
                      (p_Var2 = (_func_void_uv__work_ptr_int *)0x0, *puVar11 == 0x1d));
              p_Var23 = (_func_void_uv__work_ptr_int *)
                        ((ulong)p_Var23 | -(ulong)(p_Var23 == (_func_void_uv__work_ptr_int *)0x0));
            }
LAB_0022f841:
            if (p_Var23 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) {
              w[-1].done = p_Var27;
            }
          }
          goto LAB_0022f90c;
        }
      }
      p_Var23 = (_func_void_uv__work_ptr_int *)(local_20c8.st_dev + -(long)w[-1].done);
      w[-1].done = (_func_void_uv__work_ptr_int *)local_20c8.st_dev;
      goto LAB_0022f90c;
    case 6:
      p_Var23 = w[-6].done;
      iVar4 = uv__fs_statx(-1,(char *)p_Var23,0,0,(uv_stat_t *)buf);
      if (iVar4 == -0x26) {
        iVar4 = stat((char *)p_Var23,(stat *)local_2038);
LAB_0022eeb7:
        if (iVar4 == 0) {
          w[-6].loop = (uv_loop_s *)local_2038._0_8_;
          w[-6].wq[0] = (void *)((ulong)local_2020 & 0xffffffff);
          w[-6].wq[1] = local_2028;
          w[-5].work = (_func_void_uv__work_ptr *)((ulong)local_2020 >> 0x20);
          w[-5].done = (_func_void_uv__work_ptr_int *)(ulong)local_2018;
          w[-5].loop = local_2010;
          w[-5].wq[0] = (void *)local_2038._8_8_;
          w[-5].wq[1] = local_2008;
          w[-4].work = (_func_void_uv__work_ptr *)local_2000.__val;
          w[-4].done = (_func_void_uv__work_ptr_int *)CONCAT44(acStack_1ff4,local_1ff8);
          w[-4].wq[1] = local_1ff0;
          w[-3].work = (_func_void_uv__work_ptr *)p_Stack_1fe8;
          w[-3].done = local_1fe0;
          w[-3].loop = puStack_1fd8;
          w[-3].wq[0] = local_1fd0;
          w[-3].wq[1] = local_1fc8;
          w[-2].work = local_1fd0;
          w[-2].done = local_1fc8;
          w[-4].loop = (uv_loop_s *)0x0;
          w[-4].wq[0] = (void *)0x0;
        }
      }
      goto LAB_0022efaf;
    case 7:
      p_Var23 = w[-6].done;
      iVar4 = uv__fs_statx(-1,(char *)p_Var23,0,1,(uv_stat_t *)buf);
      if (iVar4 == -0x26) {
        iVar4 = lstat((char *)p_Var23,(stat *)local_2038);
        goto LAB_0022eeb7;
      }
LAB_0022efaf:
      p_Var23 = (_func_void_uv__work_ptr_int *)(long)iVar4;
      goto LAB_0022f90c;
    case 8:
      iVar10 = *(int *)w[-2].wq;
      iVar4 = uv__fs_statx(iVar10,"",1,0,(uv_stat_t *)buf);
      if ((iVar4 == -0x26) && (iVar4 = fstat(iVar10,(stat *)local_2038), iVar4 == 0)) {
        w[-6].loop = (uv_loop_s *)local_2038._0_8_;
        w[-6].wq[0] = (void *)((ulong)local_2020 & 0xffffffff);
        w[-6].wq[1] = local_2028;
        w[-5].work = (_func_void_uv__work_ptr *)((ulong)local_2020 >> 0x20);
        w[-5].done = (_func_void_uv__work_ptr_int *)(ulong)local_2018;
        w[-5].loop = local_2010;
        w[-5].wq[0] = (void *)local_2038._8_8_;
        w[-5].wq[1] = local_2008;
        w[-4].work = (_func_void_uv__work_ptr *)local_2000.__val;
        w[-4].done = (_func_void_uv__work_ptr_int *)CONCAT44(acStack_1ff4,local_1ff8);
        w[-4].wq[1] = local_1ff0;
        w[-3].work = (_func_void_uv__work_ptr *)p_Stack_1fe8;
        w[-3].done = local_1fe0;
        w[-3].loop = puStack_1fd8;
        w[-3].wq[0] = local_1fd0;
        w[-3].wq[1] = local_1fc8;
        w[-2].work = local_1fd0;
        w[-2].done = local_1fc8;
        w[-4].loop = (uv_loop_s *)0x0;
        w[-4].wq[0] = (void *)0x0;
      }
      break;
    case 9:
      iVar4 = ftruncate(*(int *)w[-2].wq,(__off_t)w[-1].done);
      break;
    case 10:
      lVar22 = (long)(double)w[-1].wq[0];
      pvVar12 = (void *)(((long)(((double)w[-1].wq[0] - (double)lVar22) * 1000000000.0) / 1000) *
                        1000);
      local_2038._0_8_ = ((long)pvVar12 >> 0x3f) + lVar22;
      local_2038._8_8_ = (void *)(long)((double)(long)pvVar12 + 1000000000.0);
      if (-1 < (long)pvVar12) {
        local_2038._8_8_ = pvVar12;
      }
      lVar22 = (long)(double)w[-1].wq[1];
      pvVar12 = (void *)(((long)(((double)w[-1].wq[1] - (double)lVar22) * 1000000000.0) / 1000) *
                        1000);
      local_2028 = (void *)(((long)pvVar12 >> 0x3f) + lVar22);
      local_2020 = (void *)(long)((double)(long)pvVar12 + 1000000000.0);
      if (-1 < (long)pvVar12) {
        local_2020 = pvVar12;
      }
      p_Var23 = w[-6].done;
      iVar4 = 0;
      goto LAB_0022e960;
    case 0xb:
      lVar22 = (long)(double)w[-1].wq[0];
      pvVar12 = (void *)(((long)(((double)w[-1].wq[0] - (double)lVar22) * 1000000000.0) / 1000) *
                        1000);
      local_2038._0_8_ = ((long)pvVar12 >> 0x3f) + lVar22;
      local_2038._8_8_ = (void *)(long)((double)(long)pvVar12 + 1000000000.0);
      if (-1 < (long)pvVar12) {
        local_2038._8_8_ = pvVar12;
      }
      lVar22 = (long)(double)w[-1].wq[1];
      pvVar12 = (void *)(((long)(((double)w[-1].wq[1] - (double)lVar22) * 1000000000.0) / 1000) *
                        1000);
      local_2028 = (void *)(((long)pvVar12 >> 0x3f) + lVar22);
      local_2020 = (void *)(long)((double)(long)pvVar12 + 1000000000.0);
      if (-1 < (long)pvVar12) {
        local_2020 = pvVar12;
      }
      iVar4 = futimens(*(int *)w[-2].wq,(timespec *)local_2038);
      break;
    case 0xc:
      iVar4 = access((char *)w[-6].done,*(int *)((long)w[-2].wq + 4));
      break;
    case 0xd:
      iVar4 = chmod((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
      break;
    case 0xe:
      iVar4 = fchmod(*(int *)w[-2].wq,*(__mode_t *)(w[-2].wq + 1));
      break;
    case 0xf:
      iVar4 = fsync(*(int *)w[-2].wq);
      break;
    case 0x10:
      iVar4 = fdatasync(*(int *)w[-2].wq);
      break;
    case 0x11:
      iVar4 = unlink((char *)w[-6].done);
      break;
    case 0x12:
      iVar4 = rmdir((char *)w[-6].done);
      break;
    case 0x13:
      iVar4 = mkdir((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
      break;
    case 0x14:
      pcVar18 = mkdtemp((char *)w[-6].done);
      p_Var23 = (_func_void_uv__work_ptr_int *)-(ulong)(pcVar18 == (char *)0x0);
      goto LAB_0022f90c;
    case 0x15:
      iVar4 = rename((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x16:
      local_2038._0_8_ = (uv_loop_s *)0x0;
      iVar4 = scandir((char *)w[-6].done,(dirent ***)local_2038,uv__fs_scandir_filter,
                      uv__fs_scandir_sort);
      *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
      if (iVar4 != -1) {
        if (iVar4 == 0) {
          free((void *)local_2038._0_8_);
          local_2038._0_8_ = (uv_loop_s *)0x0;
        }
        w[-6].work = (_func_void_uv__work_ptr *)local_2038._0_8_;
        goto LAB_0022ee68;
      }
LAB_0022f1fb:
      p_Var23 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      goto LAB_0022f90c;
    case 0x17:
      iVar4 = link((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x18:
      iVar4 = symlink((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x19:
      sVar17 = pathconf((char *)w[-6].done,4);
      sVar29 = 0x1000;
      if (sVar17 != 0xffffffffffffffff) {
        sVar29 = sVar17;
      }
      p_Var14 = (_func_void_uv__work_ptr *)uv__malloc(sVar29);
      if (p_Var14 == (_func_void_uv__work_ptr *)0x0) {
        *puVar11 = 0xc;
        goto LAB_0022f272;
      }
      sVar17 = readlink((char *)w[-6].done,(char *)p_Var14,sVar29);
      if (sVar17 == 0xffffffffffffffff) {
        uv__free(p_Var14);
        p_Var23 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      }
      else if ((sVar17 == sVar29) &&
              (p_Var14 = (_func_void_uv__work_ptr *)uv__reallocf(p_Var14,sVar17 + 1),
              p_Var14 == (_func_void_uv__work_ptr *)0x0)) {
        p_Var23 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      }
      else {
        p_Var14[sVar17] = (_func_void_uv__work_ptr)0x0;
        w[-6].work = p_Var14;
        p_Var23 = (_func_void_uv__work_ptr_int *)0x0;
      }
      goto LAB_0022f90c;
    case 0x1a:
      iVar4 = chown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
      break;
    case 0x1b:
      iVar4 = fchown(*(int *)w[-2].wq,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
      break;
    case 0x1c:
      p_Var14 = (_func_void_uv__work_ptr *)realpath((char *)w[-6].done,(char *)0x0);
      if (p_Var14 == (_func_void_uv__work_ptr *)0x0) goto LAB_0022f1fb;
LAB_0022e604:
      w[-6].work = p_Var14;
      p_Var23 = (_func_void_uv__work_ptr_int *)0x0;
      goto LAB_0022f90c;
    case 0x1d:
      iVar4 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-6].done,0,0,(uv_fs_cb)0x0
                        );
      uv_fs_req_cleanup((uv_fs_t *)local_2038);
      if (iVar4 < 0) {
        p_Var23 = (_func_void_uv__work_ptr_int *)(long)iVar4;
      }
      else {
        iVar10 = fstat(iVar4,&local_2158);
        __mode = local_2158.st_mode;
        if (iVar10 == 0) {
          iVar9 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-2].loop,
                             (*(uint *)((long)w[-2].wq + 4) & 1) << 7 | 0x41,local_2158.st_mode,
                             (uv_fs_cb)0x0);
          uv_fs_req_cleanup((uv_fs_t *)local_2038);
          iVar10 = iVar9;
          if (-1 < iVar9) {
            if (((ulong)w[-2].wq[0] & 0x100000000) == 0) {
              iVar10 = fstat(iVar9,&local_20c8);
              if (iVar10 == 0) {
                if (((_func_void_uv__work_ptr_int *)
                     CONCAT26(local_2158.st_dev._6_2_,
                              CONCAT24(local_2158.st_dev._4_2_,(int)local_2158.st_dev)) ==
                     (_func_void_uv__work_ptr_int *)local_20c8.st_dev) &&
                   (local_2158.st_ino == local_20c8.st_ino)) {
LAB_0022f854:
                  iVar10 = 0;
                  goto LAB_0022f86c;
                }
                iVar10 = ftruncate(iVar9,0);
                if (iVar10 == 0) goto LAB_0022f49f;
              }
LAB_0022f7c4:
              iVar10 = -*puVar11;
            }
            else {
LAB_0022f49f:
              iVar10 = fchmod(iVar9,__mode);
              if (iVar10 == -1) {
                if (*puVar11 == 1) {
                  iVar10 = uv__is_cifs_or_smb(iVar9);
                  if (iVar10 != 0) goto LAB_0022f4b3;
                  iVar10 = -1;
                }
                else {
                  iVar10 = -*puVar11;
                }
              }
              else {
LAB_0022f4b3:
                if (((ulong)w[-2].wq[0] & 0x600000000) != 0) {
                  iVar10 = ioctl(iVar9,0x40049409,iVar4);
                  if (iVar10 == 0) goto LAB_0022f854;
                  if (((ulong)w[-2].wq[0] & 0x400000000) != 0) goto LAB_0022f7c4;
                }
                p_Var23 = (_func_void_uv__work_ptr_int *)0x0;
                for (sVar29 = local_2158.st_size; sVar29 != 0; sVar29 = sVar29 - (long)p_Var27) {
                  local_2038._8_4_ = 6;
                  local_1ff8 = UV_FS_SENDFILE;
                  local_1f28 = (char *)0x0;
                  local_1f10 = (uv_buf_t *)0x0;
                  local_1fd0 = (_func_void_uv__work_ptr *)0x0;
                  local_1fe0 = (_func_void_uv__work_ptr_int *)0x0;
                  puStack_1fd8 = (uv_loop_s *)0x0;
                  local_1ff0 = (uv_loop_t *)0x0;
                  p_Stack_1fe8 = (uv_fs_cb)0x0;
                  local_1f20 = iVar9;
                  local_1f1c = iVar4;
                  local_1f08 = p_Var23;
                  local_1eb8 = sVar29;
                  uv__fs_work(&local_1ee8);
                  p_Var27 = local_1fe0;
                  uv_fs_req_cleanup((uv_fs_t *)local_2038);
                  if ((long)p_Var27 < 0) {
                    iVar10 = (int)p_Var27;
                    goto LAB_0022f86c;
                  }
                  p_Var23 = p_Var23 + (long)p_Var27;
                }
                iVar10 = 0;
              }
            }
          }
        }
        else {
          iVar9 = -1;
          iVar10 = -*puVar11;
        }
LAB_0022f86c:
        iVar26 = 0;
        if (iVar10 < 0) {
          iVar26 = iVar10;
        }
        iVar4 = uv__close_nocheckstdio(iVar4);
        if (iVar4 == 0) {
          iVar4 = iVar26;
        }
        if (iVar10 < 0) {
          iVar4 = iVar26;
        }
        if (-1 < iVar9) {
          iVar10 = uv__close_nocheckstdio(iVar9);
          if (iVar10 == 0) {
            iVar10 = iVar4;
          }
          if (iVar4 != 0) {
            iVar10 = iVar4;
          }
          iVar4 = 0;
          if (iVar10 != 0) {
            uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-2].loop,(uv_fs_cb)0x0);
            uv_fs_req_cleanup((uv_fs_t *)local_2038);
            iVar4 = iVar10;
          }
        }
        if (iVar4 == 0) {
          p_Var23 = (_func_void_uv__work_ptr_int *)0x0;
        }
        else {
          *puVar11 = -iVar4;
          p_Var23 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
        }
      }
      goto LAB_0022f90c;
    case 0x1e:
      iVar4 = lchown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4))
      ;
      break;
    case 0x1f:
      p_Var14 = (_func_void_uv__work_ptr *)uv__malloc(0x38);
      if (p_Var14 != (_func_void_uv__work_ptr *)0x0) {
        pDVar19 = opendir((char *)w[-6].done);
        *(DIR **)(p_Var14 + 0x30) = pDVar19;
        if (pDVar19 != (DIR *)0x0) {
          w[-6].work = p_Var14;
          goto LAB_0022f12d;
        }
      }
      uv__free(p_Var14);
      w[-6].work = (_func_void_uv__work_ptr *)0x0;
LAB_0022f272:
      p_Var23 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      goto LAB_0022f90c;
    case 0x20:
      p_Var14 = w[-6].work;
      if (*(long *)(p_Var14 + 8) == 0) {
        uVar8 = 0;
      }
      else {
        uVar28 = 0;
LAB_0022ecf7:
        do {
          *puVar11 = 0;
          dent = readdir(*(DIR **)(p_Var14 + 0x30));
          uVar8 = (uint)uVar28;
          if (dent == (dirent *)0x0) {
            if (*puVar11 != 0) {
LAB_0022f2f0:
              if (uVar8 != 0) {
                lVar22 = 0;
                do {
                  uv__free(*(void **)(*(long *)p_Var14 + lVar22));
                  *(undefined8 *)(*(long *)p_Var14 + lVar22) = 0;
                  lVar22 = lVar22 + 0x10;
                } while (uVar28 << 4 != lVar22);
              }
              uVar8 = 0xffffffff;
            }
            break;
          }
          pcVar18 = dent->d_name;
          iVar4 = strcmp(pcVar18,".");
          if ((iVar4 == 0) || (iVar4 = strcmp(pcVar18,".."), iVar4 == 0)) {
            if (*(ulong *)(p_Var14 + 8) <= uVar28) break;
            goto LAB_0022ecf7;
          }
          lVar22 = *(long *)p_Var14;
          pcVar18 = uv__strdup(pcVar18);
          *(char **)(lVar22 + uVar28 * 0x10) = pcVar18;
          if (pcVar18 == (char *)0x0) goto LAB_0022f2f0;
          uVar7 = uv__fs_get_dirent_type((uv__dirent_t *)dent);
          *(uv_dirent_type_t *)(lVar22 + uVar28 * 0x10 + 8) = uVar7;
          uVar8 = uVar8 + 1;
          uVar28 = (ulong)uVar8;
        } while (uVar28 < *(ulong *)(p_Var14 + 8));
      }
      p_Var23 = (_func_void_uv__work_ptr_int *)(long)(int)uVar8;
      goto LAB_0022f90c;
    case 0x21:
      p_Var14 = w[-6].work;
      pDVar19 = *(DIR **)(p_Var14 + 0x30);
      if (pDVar19 != (DIR *)0x0) {
        closedir(pDVar19);
        *(undefined8 *)(p_Var14 + 0x30) = 0;
      }
      uv__free(w[-6].work);
      w[-6].work = (_func_void_uv__work_ptr *)0x0;
LAB_0022f12d:
      p_Var23 = (_func_void_uv__work_ptr_int *)0x0;
      goto LAB_0022f90c;
    case 0x22:
      iVar4 = statfs((char *)w[-6].done,(statfs *)local_2038);
      p_Var23 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      if (iVar4 == 0) {
        p_Var14 = (_func_void_uv__work_ptr *)uv__malloc(0x58);
        if (p_Var14 != (_func_void_uv__work_ptr *)0x0) {
          *(undefined8 *)p_Var14 = local_2038._0_8_;
          *(undefined8 *)(p_Var14 + 8) = local_2038._8_8_;
          *(void **)(p_Var14 + 0x10) = local_2028;
          *(void **)(p_Var14 + 0x18) = local_2020;
          *(long *)(p_Var14 + 0x20) = CONCAT44(iStack_2014,local_2018);
          *(uv_loop_s **)(p_Var14 + 0x28) = local_2010;
          *(void **)(p_Var14 + 0x30) = local_2008;
          goto LAB_0022e604;
        }
        *puVar11 = 0xc;
      }
      goto LAB_0022f90c;
    case 0x23:
      p_Var23 = w[-6].done;
      sVar13 = strlen((char *)p_Var23);
      if ((sVar13 < 6) || (iVar4 = strcmp((char *)(p_Var23 + (sVar13 - 6)),"XXXXXX"), iVar4 != 0)) {
        *puVar11 = 0x16;
        iVar4 = -1;
      }
      else {
        uv_once(&uv__fs_mkstemp_once,uv__mkostemp_initonce);
        if (uv__mkostemp != (_func_int_char_ptr_int *)0x0 &&
            (uv__fs_mkstemp_no_cloexec_support & 1) == 0) {
          iVar4 = (*uv__mkostemp)((char *)p_Var23,0x80000);
          if (-1 < iVar4) goto LAB_0022ee68;
          if (*puVar11 != 0x16) goto LAB_0022e54b;
          uv__fs_mkstemp_no_cloexec_support = 1;
        }
        if (w[-7].wq[0] != (void *)0x0) {
          uv_rwlock_rdlock(&(w[-7].loop)->cloexec_lock);
        }
        iVar4 = mkstemp((char *)p_Var23);
        if ((-1 < iVar4) && (iVar10 = uv__cloexec(iVar4,1), iVar10 != 0)) {
          iVar10 = uv__close(iVar4);
          iVar4 = -1;
          if (iVar10 != 0) {
switchD_0022e3de_default:
            abort();
          }
        }
        if (w[-7].wq[0] != (void *)0x0) {
          uv_rwlock_rdunlock(&(w[-7].loop)->cloexec_lock);
        }
      }
LAB_0022e54b:
      if (iVar4 < 0) {
        *p_Var23 = (_func_void_uv__work_ptr_int)0x0;
      }
LAB_0022ee68:
      p_Var23 = (_func_void_uv__work_ptr_int *)(long)iVar4;
      goto LAB_0022f90c;
    case 0x24:
      lVar22 = (long)(double)w[-1].wq[0];
      pvVar12 = (void *)(((long)(((double)w[-1].wq[0] - (double)lVar22) * 1000000000.0) / 1000) *
                        1000);
      local_2038._0_8_ = ((long)pvVar12 >> 0x3f) + lVar22;
      local_2038._8_8_ = (void *)(long)((double)(long)pvVar12 + 1000000000.0);
      if (-1 < (long)pvVar12) {
        local_2038._8_8_ = pvVar12;
      }
      lVar22 = (long)(double)w[-1].wq[1];
      pvVar12 = (void *)(((long)(((double)w[-1].wq[1] - (double)lVar22) * 1000000000.0) / 1000) *
                        1000);
      local_2028 = (void *)(((long)pvVar12 >> 0x3f) + lVar22);
      local_2020 = (void *)(long)((double)(long)pvVar12 + 1000000000.0);
      if (-1 < (long)pvVar12) {
        local_2020 = pvVar12;
      }
      p_Var23 = w[-6].done;
      iVar4 = 0x100;
LAB_0022e960:
      iVar4 = utimensat(-100,(char *)p_Var23,(timespec *)local_2038,iVar4);
      break;
    default:
      goto switchD_0022e3de_default;
    }
    p_Var23 = (_func_void_uv__work_ptr_int *)(long)iVar4;
LAB_0022f90c:
    p_Var27 = p_Var23;
    if (p_Var23 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) goto LAB_0022f9a4;
  } while ((iVar1 - 4U < 0xfffffffe) && (*puVar11 == 4));
  p_Var27 = (_func_void_uv__work_ptr_int *)-(long)(int)*puVar11;
LAB_0022f9a4:
  w[-7].wq[1] = p_Var27;
  if ((p_Var23 == (_func_void_uv__work_ptr_int *)0x0) && (*(int *)&w[-7].done - 6U < 3)) {
    w[-6].work = (_func_void_uv__work_ptr *)buf;
  }
  return;
LAB_0022e82a:
  lVar22 = local_2168 + sVar15;
  sVar13 = sVar16 - lVar22;
  if (sVar13 == 0 || (long)sVar16 < lVar22) goto LAB_0022e841;
  goto LAB_0022e7a4;
}

Assistant:

static void uv__fs_work(struct uv__work* w) {
  int retry_on_eintr;
  uv_fs_t* req;
  ssize_t r;

  req = container_of(w, uv_fs_t, work_req);
  retry_on_eintr = !(req->fs_type == UV_FS_CLOSE ||
                     req->fs_type == UV_FS_READ);

  do {
    errno = 0;

#define X(type, action)                                                       \
  case UV_FS_ ## type:                                                        \
    r = action;                                                               \
    break;

    switch (req->fs_type) {
    X(ACCESS, access(req->path, req->flags));
    X(CHMOD, chmod(req->path, req->mode));
    X(CHOWN, chown(req->path, req->uid, req->gid));
    X(CLOSE, uv__fs_close(req->file));
    X(COPYFILE, uv__fs_copyfile(req));
    X(FCHMOD, fchmod(req->file, req->mode));
    X(FCHOWN, fchown(req->file, req->uid, req->gid));
    X(LCHOWN, lchown(req->path, req->uid, req->gid));
    X(FDATASYNC, uv__fs_fdatasync(req));
    X(FSTAT, uv__fs_fstat(req->file, &req->statbuf));
    X(FSYNC, uv__fs_fsync(req));
    X(FTRUNCATE, ftruncate(req->file, req->off));
    X(FUTIME, uv__fs_futime(req));
    X(LUTIME, uv__fs_lutime(req));
    X(LSTAT, uv__fs_lstat(req->path, &req->statbuf));
    X(LINK, link(req->path, req->new_path));
    X(MKDIR, mkdir(req->path, req->mode));
    X(MKDTEMP, uv__fs_mkdtemp(req));
    X(MKSTEMP, uv__fs_mkstemp(req));
    X(OPEN, uv__fs_open(req));
    X(READ, uv__fs_read(req));
    X(SCANDIR, uv__fs_scandir(req));
    X(OPENDIR, uv__fs_opendir(req));
    X(READDIR, uv__fs_readdir(req));
    X(CLOSEDIR, uv__fs_closedir(req));
    X(READLINK, uv__fs_readlink(req));
    X(REALPATH, uv__fs_realpath(req));
    X(RENAME, rename(req->path, req->new_path));
    X(RMDIR, rmdir(req->path));
    X(SENDFILE, uv__fs_sendfile(req));
    X(STAT, uv__fs_stat(req->path, &req->statbuf));
    X(STATFS, uv__fs_statfs(req));
    X(SYMLINK, symlink(req->path, req->new_path));
    X(UNLINK, unlink(req->path));
    X(UTIME, uv__fs_utime(req));
    X(WRITE, uv__fs_write_all(req));
    default: abort();
    }
#undef X
  } while (r == -1 && errno == EINTR && retry_on_eintr);

  if (r == -1)
    req->result = UV__ERR(errno);
  else
    req->result = r;

  if (r == 0 && (req->fs_type == UV_FS_STAT ||
                 req->fs_type == UV_FS_FSTAT ||
                 req->fs_type == UV_FS_LSTAT)) {
    req->ptr = &req->statbuf;
  }
}